

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledRgbaInputFile::readTiles
          (TiledRgbaInputFile *this,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  int dx;
  int dx_00;
  int dy;
  lock_guard<std::mutex> lock;
  
  __mutex = (pthread_mutex_t *)this->_fromYa;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    for (; dx_00 = dxMin, dyMin <= dyMax; dyMin = dyMin + 1) {
      for (; dx_00 <= dxMax; dx_00 = dx_00 + 1) {
        FromYa::readTile(this->_fromYa,dx_00,dyMin,lx,ly);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  TiledInputFile::readTiles(this->_inputFile,dxMin,dxMax,dyMin,dyMax,lx,ly);
  return;
}

Assistant:

void
TiledRgbaInputFile::readTiles (
    int dxMin, int dxMax, int dyMin, int dyMax, int lx, int ly)
{
    if (_fromYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_fromYa);
#endif
        for (int dy = dyMin; dy <= dyMax; dy++)
            for (int dx = dxMin; dx <= dxMax; dx++)
                _fromYa->readTile (dx, dy, lx, ly);
    }
    else { _inputFile->readTiles (dxMin, dxMax, dyMin, dyMax, lx, ly); }
}